

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

void __thiscall
gflags::FlagRegisterer::FlagRegisterer<double>
          (FlagRegisterer *this,char *name,char *help,char *filename,double *current_storage,
          double *defvalue_storage)

{
  FlagValue *current;
  FlagValue *defvalue;
  
  current = (FlagValue *)operator_new(0x10);
  current->value_buffer_ = current_storage;
  current->type_ = '\x05';
  current->owns_value_ = false;
  defvalue = (FlagValue *)operator_new(0x10);
  defvalue->value_buffer_ = defvalue_storage;
  defvalue->type_ = '\x05';
  defvalue->owns_value_ = false;
  anon_unknown_2::RegisterCommandLineFlag(name,help,filename,current,defvalue);
  return;
}

Assistant:

FlagRegisterer::FlagRegisterer(const char* name,
                               const char* help,
                               const char* filename,
                               FlagType* current_storage,
                               FlagType* defvalue_storage) {
  FlagValue* const current = new FlagValue(current_storage, false);
  FlagValue* const defvalue = new FlagValue(defvalue_storage, false);
  RegisterCommandLineFlag(name, help, filename, current, defvalue);
}